

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_builtin_primitive_outputs_in_struct(CompilerHLSL *this)

{
  size_t count;
  _Hash_node_base *p_Var1;
  AlignedBuffer<unsigned_int,_8UL> *pAVar2;
  uint *puVar3;
  SmallVector<unsigned_int,_8UL> *__range2;
  long lVar4;
  long lVar5;
  uint32_t i;
  ulong uVar6;
  SmallVector<unsigned_int,_8UL> local_68;
  anon_class_8_1_8991fb9c local_30;
  
  uVar6 = 0;
  local_30.this = this;
  do {
    if (((this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower >> (uVar6 & 0x3f) &
        1) != 0) {
      emit_builtin_primitive_outputs_in_struct::anon_class_8_1_8991fb9c::operator()
                (&local_30,(uint32_t)uVar6);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x40);
  count = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
          _M_element_count;
  if (count != 0) {
    local_68.super_VectorView<unsigned_int>.buffer_size = 0;
    local_68.buffer_capacity = 8;
    local_68.super_VectorView<unsigned_int>.ptr = (uint *)&local_68.stack_storage;
    SmallVector<unsigned_int,_8UL>::reserve(&local_68,count);
    pAVar2 = (AlignedBuffer<unsigned_int,_8UL> *)local_68.super_VectorView<unsigned_int>.ptr;
    for (p_Var1 = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
                  _M_before_begin._M_nxt;
        local_68.super_VectorView<unsigned_int>.ptr = (uint *)pAVar2,
        p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
      SmallVector<unsigned_int,_8UL>::reserve
                (&local_68,local_68.super_VectorView<unsigned_int>.buffer_size + 1);
      *(undefined4 *)
       ((char *)local_68.super_VectorView<unsigned_int>.ptr +
       local_68.super_VectorView<unsigned_int>.buffer_size * 4) = *(undefined4 *)&p_Var1[1]._M_nxt;
      local_68.super_VectorView<unsigned_int>.buffer_size =
           local_68.super_VectorView<unsigned_int>.buffer_size + 1;
      pAVar2 = (AlignedBuffer<unsigned_int,_8UL> *)local_68.super_VectorView<unsigned_int>.ptr;
    }
    if (local_68.super_VectorView<unsigned_int>.buffer_size != 0) {
      lVar5 = local_68.super_VectorView<unsigned_int>.buffer_size * 4;
      lVar4 = 0x3f;
      if (local_68.super_VectorView<unsigned_int>.buffer_size != 0) {
        for (; local_68.super_VectorView<unsigned_int>.buffer_size >> lVar4 == 0; lVar4 = lVar4 + -1
            ) {
        }
      }
      ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pAVar2,pAVar2->aligned_char + lVar5,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (pAVar2,pAVar2->aligned_char + lVar5);
    }
    puVar3 = local_68.super_VectorView<unsigned_int>.ptr;
    if (local_68.super_VectorView<unsigned_int>.buffer_size != 0) {
      lVar5 = local_68.super_VectorView<unsigned_int>.buffer_size << 2;
      lVar4 = 0;
      do {
        emit_builtin_primitive_outputs_in_struct::anon_class_8_1_8991fb9c::operator()
                  (&local_30,*(uint32_t *)((char *)puVar3 + lVar4));
        lVar4 = lVar4 + 4;
      } while (lVar5 != lVar4);
    }
    local_68.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_68.super_VectorView<unsigned_int>.ptr !=
        &local_68.stack_storage) {
      free(local_68.super_VectorView<unsigned_int>.ptr);
    }
  }
  return;
}

Assistant:

void CompilerHLSL::emit_builtin_primitive_outputs_in_struct()
{
	active_output_builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		const char *semantic = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		switch (builtin)
		{
		case BuiltInLayer:
		{
			if (hlsl_options.shader_model < 50)
				SPIRV_CROSS_THROW("Render target array index output is only supported in SM 5.0 or higher.");
			type = "uint";
			semantic = "SV_RenderTargetArrayIndex";
			break;
		}

		case BuiltInPrimitiveId:
			type = "uint";
			semantic = "SV_PrimitiveID";
			break;

		case BuiltInViewportIndex:
			type = "uint";
			semantic = "SV_ViewportArrayIndex";
			break;

		case BuiltInPrimitiveShadingRateKHR:
			type = "uint";
			semantic = "SV_ShadingRate";
			break;

		case BuiltInCullPrimitiveEXT:
			type = "bool";
			semantic = "SV_CullPrimitive";
			break;

		default:
			break;
		}

		if (type && semantic)
			statement(type, " ", builtin_to_glsl(builtin, StorageClassOutput), " : ", semantic, ";");
	});
}